

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O2

double anon_unknown.dwarf_1b803::sampleY<float>
                 (TypedImageChannel<float> *channel,int h,int x,double y,Extrapolation ext)

{
  uint x_00;
  float fVar1;
  long lVar2;
  uint x_01;
  int iVar3;
  int iVar4;
  float *pfVar5;
  uint uVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  
  x_01 = Imath_3_2::floor<double>(y);
  x_00 = x_01 + 1;
  switch(ext) {
  case BLACK:
    dVar9 = 0.0;
    dVar8 = 0.0;
    if ((int)x_01 < h && -1 < (int)x_01) {
      dVar8 = (double)(channel->_pixels)._data[(ulong)x_01 * (channel->_pixels)._sizeY + (long)x];
    }
    if (h <= (int)x_00 || (int)x_01 < -1) goto LAB_00108c3f;
    pfVar5 = (channel->_pixels)._data + (ulong)x_00 * (channel->_pixels)._sizeY + (long)x;
    goto LAB_00108c2d;
  case CLAMP:
    uVar7 = h - 1;
    uVar6 = uVar7;
    if ((int)x_01 < (int)uVar7) {
      uVar6 = x_01;
    }
    if ((int)x_01 < 0) {
      uVar6 = 0;
    }
    if ((int)x_00 < (int)uVar7) {
      uVar7 = x_00;
    }
    if ((int)x_01 < -1) {
      uVar7 = 0;
    }
    lVar2 = (channel->_pixels)._sizeY;
    pfVar5 = (channel->_pixels)._data;
    fVar1 = pfVar5[(int)uVar6 * lVar2 + (long)x];
    pfVar5 = pfVar5 + (int)uVar7 * lVar2 + (long)x;
    goto LAB_00108c27;
  case PERIODIC:
    iVar3 = Imath_3_2::modp(x_01,h);
    iVar4 = Imath_3_2::modp(x_00,h);
    break;
  case MIRROR:
    iVar3 = mirror(x_01,h);
    iVar4 = mirror(x_00,h);
    break;
  default:
    dVar8 = 0.0;
    dVar9 = 0.0;
    goto LAB_00108c3f;
  }
  lVar2 = (channel->_pixels)._sizeY;
  pfVar5 = (channel->_pixels)._data;
  fVar1 = pfVar5[iVar3 * lVar2 + (long)x];
  pfVar5 = pfVar5 + iVar4 * lVar2 + (long)x;
LAB_00108c27:
  dVar8 = (double)fVar1;
LAB_00108c2d:
  dVar9 = (double)*pfVar5;
LAB_00108c3f:
  return ((double)(int)x_00 - y) * dVar8 + (1.0 - ((double)(int)x_00 - y)) * dVar9;
}

Assistant:

double
sampleY (
    const TypedImageChannel<T>& channel,
    int                         h,
    int                         x,
    double                      y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is an integer, and y is a floating point number.
    //

    int    ys = IMATH_NAMESPACE::floor (y);
    int    yt = ys + 1;
    double s  = yt - y;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (ys >= 0 && ys < h) ? double (channel (x, ys)) : 0.0;
            vt = (yt >= 0 && yt < h) ? double (channel (x, yt)) : 0.0;
            break;

        case CLAMP:

            ys = IMATH_NAMESPACE::clamp (ys, 0, h - 1);
            yt = IMATH_NAMESPACE::clamp (yt, 0, h - 1);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case PERIODIC:

            ys = modp (ys, h);
            yt = modp (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case MIRROR:

            ys = mirror (ys, h);
            yt = mirror (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;
    }

    return s * vs + t * vt;
}